

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void pnga_merge_distr_patch
               (Integer g_a,Integer *alo,Integer *ahi,Integer g_b,Integer *blo,Integer *bhi)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  logical lVar5;
  Integer IVar6;
  long lVar7;
  long lVar8;
  Integer *hi;
  Integer in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  char *in_R8;
  long in_R9;
  Integer p_handle;
  Integer intersect;
  Integer idim;
  Integer i;
  void *one;
  void *src_data_ptr;
  long l_one;
  float f_one;
  float c_one [2];
  double z_one [2];
  Integer i_one;
  Integer type;
  double d_one;
  char trans [2];
  Integer dhi [7];
  Integer dlo [7];
  Integer mld [7];
  Integer mhi [7];
  Integer mlo [7];
  Integer bdim;
  Integer adim;
  Integer b_handle;
  Integer a_handle;
  Integer local_sync_end;
  Integer local_sync_begin;
  Integer *in_stack_00000878;
  Integer in_stack_00000880;
  Integer *in_stack_00000888;
  Integer *in_stack_00000890;
  Integer in_stack_00000898;
  char *in_stack_000008a0;
  Integer *in_stack_000008b0;
  void *in_stack_fffffffffffffdd8;
  Integer *in_stack_fffffffffffffde0;
  void *in_stack_fffffffffffffde8;
  Integer *lo;
  long in_stack_fffffffffffffe00;
  long local_1f8;
  long local_198;
  Integer *in_stack_fffffffffffffe70;
  Integer *in_stack_fffffffffffffe78;
  Integer in_stack_fffffffffffffe80;
  long local_158 [16];
  long local_d8 [8];
  long local_98 [2];
  Integer in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  
  iVar2 = _ga_sync_end;
  iVar1 = _ga_sync_begin;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (iVar1 != 0) {
    pnga_sync();
  }
  pnga_check_handle(in_RCX,in_R8);
  pnga_check_handle(in_RCX,in_R8);
  lVar3 = in_RDI + 1000;
  lVar4 = in_RCX + 1000;
  lVar5 = pnga_is_mirrored(in_RDI);
  if (lVar5 == 0) {
    IVar6 = pnga_cluster_nnodes();
    if (IVar6 < 2) {
      pnga_copy_patch(in_stack_000008a0,in_stack_00000898,in_stack_00000890,in_stack_00000888,
                      in_stack_00000880,in_stack_00000878,in_stack_000008b0);
      return;
    }
    pnga_error(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  lVar5 = pnga_is_mirrored(in_RCX);
  if ((lVar5 != 0) && (IVar6 = pnga_cluster_nnodes(), IVar6 != 0)) {
    pnga_error(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  lVar7 = (long)GA[lVar3].ndim;
  lVar8 = (long)GA[lVar4].ndim;
  hi = (Integer *)(long)GA[lVar3].p_handle;
  if (lVar7 != lVar8) {
    pnga_error(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  iVar1 = GA[lVar3].type;
  if (iVar1 != GA[lVar4].type) {
    pnga_error(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  for (local_1f8 = 0; local_1f8 < lVar7; local_1f8 = local_1f8 + 1) {
    in_stack_fffffffffffffe00 = GA[lVar3].dims[local_1f8];
    if ((((*(long *)(in_RSI + local_1f8 * 8) < 0) ||
         (in_stack_fffffffffffffe00 <= *(long *)(in_RSI + local_1f8 * 8))) ||
        (*(long *)(in_RDX + local_1f8 * 8) < 0)) ||
       ((in_stack_fffffffffffffe00 <= *(long *)(in_RDX + local_1f8 * 8) ||
        (*(long *)(in_RDX + local_1f8 * 8) < *(long *)(in_RSI + local_1f8 * 8))))) {
      pnga_error(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
  }
  for (local_1f8 = 0; local_1f8 < lVar8; local_1f8 = local_1f8 + 1) {
    in_stack_fffffffffffffe00 = GA[lVar4].dims[local_1f8];
    if (((*(long *)(in_R8 + local_1f8 * 8) < 0) ||
        (in_stack_fffffffffffffe00 <= *(long *)(in_R8 + local_1f8 * 8))) ||
       ((*(long *)(in_R9 + local_1f8 * 8) < 0 ||
        ((in_stack_fffffffffffffe00 <= *(long *)(in_R9 + local_1f8 * 8) ||
         (*(long *)(in_R9 + local_1f8 * 8) < *(long *)(in_R8 + local_1f8 * 8))))))) {
      pnga_error(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
  }
  for (local_1f8 = 0; local_1f8 < lVar8; local_1f8 = local_1f8 + 1) {
    in_stack_fffffffffffffe00 = GA[lVar4].dims[local_1f8];
    if (*(long *)(in_RDX + local_1f8 * 8) - *(long *)(in_RSI + local_1f8 * 8) !=
        *(long *)(in_R9 + local_1f8 * 8) - *(long *)(in_R8 + local_1f8 * 8)) {
      pnga_error(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
  }
  pnga_zero_patch(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  pnga_distribution(dlo[6],dlo[5],(Integer *)dlo[4],(Integer *)dlo[3]);
  lo = (Integer *)0x1;
  for (local_1f8 = 0; local_1f8 < lVar7; local_1f8 = local_1f8 + 1) {
    if (local_d8[local_1f8] < *(long *)(in_RSI + local_1f8 * 8)) {
      lo = (Integer *)0x0;
    }
    if (*(long *)(in_RDX + local_1f8 * 8) < local_98[local_1f8]) {
      lo = (Integer *)0x0;
    }
  }
  if (lo != (Integer *)0x0) {
    for (local_1f8 = 0; local_1f8 < lVar7; local_1f8 = local_1f8 + 1) {
      if (*(long *)(in_RSI + local_1f8 * 8) < local_98[local_1f8]) {
        in_stack_fffffffffffffde8 = (void *)local_98[local_1f8];
      }
      else {
        in_stack_fffffffffffffde8 = *(void **)(in_RSI + local_1f8 * 8);
      }
      local_98[local_1f8] = (long)in_stack_fffffffffffffde8;
      if (local_d8[local_1f8] < *(long *)(in_RDX + local_1f8 * 8)) {
        in_stack_fffffffffffffde0 = (Integer *)local_d8[local_1f8];
      }
      else {
        in_stack_fffffffffffffde0 = *(Integer **)(in_RDX + local_1f8 * 8);
      }
      local_d8[local_1f8] = (long)in_stack_fffffffffffffde0;
    }
    pnga_access_ptr(a_handle,(Integer *)b_handle,(Integer *)adim,(void *)bdim,(Integer *)mlo[6]);
    for (local_1f8 = 0; local_1f8 < lVar7; local_1f8 = local_1f8 + 1) {
      local_158[local_1f8] =
           (*(long *)(in_R8 + local_1f8 * 8) + local_98[local_1f8]) -
           *(long *)(in_RSI + local_1f8 * 8);
      (&local_198)[local_1f8] =
           (*(long *)(in_R8 + local_1f8 * 8) + local_d8[local_1f8]) -
           *(long *)(in_RSI + local_1f8 * 8);
    }
    if (((((iVar1 != 0x3ec) && (iVar1 != 0x3ef)) && (iVar1 != 0x3ee)) &&
        ((iVar1 != 0x3eb && (iVar1 != 0x3e9)))) && (iVar1 != 0x3ea)) {
      pnga_error(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    pnga_acc(in_stack_fffffffffffffe00,lo,hi,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
             in_stack_fffffffffffffdd8);
  }
  if (iVar2 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_merge_distr_patch(Integer g_a, Integer *alo, Integer *ahi,
                            Integer g_b, Integer *blo, Integer *bhi)
/*    Integer g_a  handle to mirrored array
      Integer *alo  indices of lower corner of mirrored array patch
      Integer *ahi  indices of upper corner of mirrored array patch
      Integer g_b  handle to distributed array
      Integer *blo  indices of lower corner of distributed array patch
      Integer *bhi  indices of upper corner of distributed array patch
*/
{
  Integer local_sync_begin, local_sync_end;
  Integer a_handle, b_handle, adim, bdim;
  Integer mlo[MAXDIM], mhi[MAXDIM], mld[MAXDIM];
  Integer dlo[MAXDIM], dhi[MAXDIM];
  char trans[2];
  double d_one;
  Integer type, i_one;
  double z_one[2];
  float  c_one[2];
  float f_one;
  long l_one;
  void *src_data_ptr;
  void *one = NULL;
  Integer i, idim, intersect, p_handle;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end = 1; /*remove any previous masking */
  if (local_sync_begin) pnga_sync();
  pnga_check_handle(g_a, "nga_merge_distr_patch");
  pnga_check_handle(g_b, "nga_merge_distr_patch");

  /* check to make sure that both patches lie within global arrays and
     that patches are the same dimensions */
  a_handle = GA_OFFSET + g_a;
  b_handle = GA_OFFSET + g_b;

  if (!pnga_is_mirrored(g_a)) {
    if (pnga_cluster_nnodes() > 1) {
      pnga_error("Handle to a non-mirrored array passed",0);
    } else {
      trans[0] = 'N';
      trans[1] = '\0';
      pnga_copy_patch(trans, g_a, alo, ahi, g_b, blo, bhi);
      return;
    }
  }

  if (pnga_is_mirrored(g_b) && pnga_cluster_nnodes())
    pnga_error("Distributed array is mirrored",0);

  adim = GA[a_handle].ndim;
  bdim = GA[b_handle].ndim;

  p_handle = GA[a_handle].p_handle;

  if (adim != bdim)
    pnga_error("Global arrays must have same dimension",0);

  type = GA[a_handle].type;
  if (type != GA[b_handle].type)
    pnga_error("Global arrays must be of same type",0);

  for (i=0; i<adim; i++) {
    idim = (Integer)GA[a_handle].dims[i];
    if (alo[i] < 0 || alo[i] >= idim || ahi[i] < 0 || ahi[i] >= idim ||
        alo[i] > ahi[i])
      pnga_error("Invalid patch index on mirrored GA",0);
  }
  for (i=0; i<bdim; i++) {
    idim = GA[b_handle].dims[i];
    if (blo[i] < 0 || blo[i] >= idim || bhi[i] < 0 || bhi[i] >= idim ||
        blo[i] > bhi[i])
      pnga_error("Invalid patch index on distributed GA",0);
  }
  for (i=0; i<bdim; i++) {
    idim = (Integer)GA[b_handle].dims[i];
    if (ahi[i] - alo[i] != bhi[i] - blo[i])
      pnga_error("Patch dimensions do not match for index ",i);
  }
  pnga_zero_patch(g_b, blo, bhi);

  /* Find coordinates of mirrored array patch that I own */
  i = PGRP_LIST[p_handle].map_proc_list[GAme];
  pnga_distribution(g_a, i, mlo, mhi);
  /* Check to see if mirrored array patch intersects my portion of
     mirrored array */
  intersect = 1;
  for (i=0; i<adim; i++) {
    if (mhi[i] < alo[i]) intersect = 0;
    if (mlo[i] > ahi[i]) intersect = 0;
  }
  if (intersect) {
    /* get portion of mirrored array patch that actually resides on this
       processor */
    for (i=0; i<adim; i++) {
      mlo[i] = GA_MAX(alo[i],mlo[i]);
      mhi[i] = GA_MIN(ahi[i],mhi[i]);
    }

    /* get pointer to locally held distribution */
    pnga_access_ptr(g_a, mlo, mhi, &src_data_ptr, mld);

    /* find indices in distributed array corresponding to this patch */
    for (i=0; i<adim; i++) {
      dlo[i] = blo[i] + mlo[i]-alo[i];
      dhi[i] = blo[i] + mhi[i]-alo[i];
    }

    /* perform accumulate */
    if (type == C_DBL) {
      d_one = 1.0;
      one = &d_one;
    } else if (type == C_DCPL) {
      z_one[0] = 1.0;
      z_one[1] = 0.0;
      one = &z_one;
    } else if (type == C_SCPL) {
      c_one[0] = 1.0;
      c_one[1] = 0.0;
      one = &c_one;
    } else if (type == C_FLOAT) {
      f_one = 1.0;
      one = &f_one;
    } else if (type == C_INT) {
      i_one = 1;
      one = &i_one;
    } else if (type == C_LONG) {
      l_one = 1;
      one = &l_one;
    } else {
      pnga_error("Type not supported",type);
    }
    pnga_acc(g_b, dlo, dhi, src_data_ptr, mld, one);
  }
  if (local_sync_end) pnga_sync();
}